

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::BayesianProbitRegressor::ByteSizeLong(BayesianProbitRegressor *this)

{
  long lVar1;
  size_type sVar2;
  BayesianProbitRegressor_Gaussian *pBVar3;
  int iVar4;
  uint uVar5;
  Type *this_00;
  size_t sVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  uint index;
  
  uVar7 = (this->features_).super_RepeatedPtrFieldBase.current_size_;
  uVar10 = (ulong)uVar7;
  index = 0;
  if (uVar10 == 0) {
    uVar10 = 0;
  }
  else {
    do {
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
                          (&(this->features_).super_RepeatedPtrFieldBase,index);
      sVar6 = BayesianProbitRegressor_FeatureWeight::ByteSizeLong(this_00);
      uVar5 = (uint)sVar6 | 1;
      iVar4 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar4 == 0; iVar4 = iVar4 + -1) {
        }
      }
      uVar10 = uVar10 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6);
      index = index + 1;
    } while (uVar7 != index);
  }
  sVar2 = ((this->regressioninputfeaturename_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar7 = (uint)sVar2 | 1;
    iVar4 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    uVar10 = uVar10 + sVar2 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  sVar2 = ((this->optimisminputfeaturename_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar7 = (uint)sVar2 | 1;
    iVar4 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    uVar10 = uVar10 + sVar2 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  sVar2 = ((this->samplingscaleinputfeaturename_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar7 = (uint)sVar2 | 1;
    iVar4 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    uVar10 = uVar10 + sVar2 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  sVar2 = ((this->samplingtruncationinputfeaturename_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar7 = (uint)sVar2 | 1;
    iVar4 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    uVar10 = uVar10 + sVar2 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  sVar2 = ((this->meanoutputfeaturename_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar7 = (uint)sVar2 | 1;
    iVar4 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    uVar10 = uVar10 + sVar2 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  sVar2 = ((this->varianceoutputfeaturename_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar7 = (uint)sVar2 | 1;
    iVar4 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    uVar10 = uVar10 + sVar2 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  sVar2 = ((this->pessimisticprobabilityoutputfeaturename_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar7 = (uint)sVar2 | 1;
    iVar4 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    uVar10 = uVar10 + sVar2 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  sVar2 = ((this->sampledprobabilityoutputfeaturename_).ptr_)->_M_string_length;
  if (sVar2 != 0) {
    uVar7 = (uint)sVar2 | 1;
    iVar4 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    uVar10 = uVar10 + sVar2 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  pBVar3 = this->bias_;
  if (pBVar3 != (BayesianProbitRegressor_Gaussian *)0x0 &&
      this != (BayesianProbitRegressor *)&_BayesianProbitRegressor_default_instance_) {
    uVar8 = (ulong)(-(uint)(pBVar3->mean_ != 0.0) & 1);
    lVar1 = uVar8 * 9 + 9;
    lVar9 = uVar8 * 9;
    if (pBVar3->precision_ != 0.0) {
      lVar9 = lVar1;
    }
    if (NAN(pBVar3->precision_)) {
      lVar9 = lVar1;
    }
    pBVar3->_cached_size_ = (int)lVar9;
    uVar10 = uVar10 + lVar9 + 2;
  }
  if (this->numberoffeatures_ != 0) {
    uVar7 = this->numberoffeatures_ | 1;
    iVar4 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    uVar10 = uVar10 + (iVar4 * 9 + 0x49U >> 6) + 1;
  }
  this->_cached_size_ = (int)uVar10;
  return uVar10;
}

Assistant:

size_t BayesianProbitRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.BayesianProbitRegressor)
  size_t total_size = 0;

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
  {
    unsigned int count = this->features_size();
    total_size += 1UL * count;
    for (unsigned int i = 0; i < count; i++) {
      total_size +=
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          this->features(i));
    }
  }

  // string regressionInputFeatureName = 10;
  if (this->regressioninputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->regressioninputfeaturename());
  }

  // string optimismInputFeatureName = 11;
  if (this->optimisminputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->optimisminputfeaturename());
  }

  // string samplingScaleInputFeatureName = 12;
  if (this->samplingscaleinputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->samplingscaleinputfeaturename());
  }

  // string samplingTruncationInputFeatureName = 13;
  if (this->samplingtruncationinputfeaturename().size() > 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->samplingtruncationinputfeaturename());
  }

  // string meanOutputFeatureName = 20;
  if (this->meanoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->meanoutputfeaturename());
  }

  // string varianceOutputFeatureName = 21;
  if (this->varianceoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->varianceoutputfeaturename());
  }

  // string pessimisticProbabilityOutputFeatureName = 22;
  if (this->pessimisticprobabilityoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->pessimisticprobabilityoutputfeaturename());
  }

  // string sampledProbabilityOutputFeatureName = 23;
  if (this->sampledprobabilityoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->sampledprobabilityoutputfeaturename());
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
  if (this->has_bias()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->bias_);
  }

  // uint32 numberOfFeatures = 1;
  if (this->numberoffeatures() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::UInt32Size(
        this->numberoffeatures());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}